

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCut.c
# Opt level: O0

int Ivy_NodeCutFindOrAdd(Ivy_Store_t *pCutStore,Ivy_Cut_t *pCutNew)

{
  int iVar1;
  long lVar2;
  int local_30;
  int local_2c;
  int k;
  int i;
  Ivy_Cut_t *pCut;
  Ivy_Cut_t *pCutNew_local;
  Ivy_Store_t *pCutStore_local;
  
  if (pCutNew->uHash == 0) {
    __assert_fail("pCutNew->uHash",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyCut.c"
                  ,0x2ac,"int Ivy_NodeCutFindOrAdd(Ivy_Store_t *, Ivy_Cut_t *)");
  }
  local_2c = 0;
  do {
    if (pCutStore->nCuts <= local_2c) {
      if (pCutStore->nCuts < pCutStore->nCutsMax) {
        iVar1 = pCutStore->nCuts;
        pCutStore->nCuts = iVar1 + 1;
        memcpy(pCutStore->pCuts + iVar1,pCutNew,0x24);
        return 0;
      }
      __assert_fail("pCutStore->nCuts < pCutStore->nCutsMax",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyCut.c"
                    ,0x2ba,"int Ivy_NodeCutFindOrAdd(Ivy_Store_t *, Ivy_Cut_t *)");
    }
    lVar2 = (long)local_2c;
    if ((pCutStore->pCuts[lVar2].uHash == pCutNew->uHash) &&
       (pCutStore->pCuts[lVar2].nSize == pCutNew->nSize)) {
      for (local_30 = 0;
          (local_30 < pCutNew->nSize &&
          (pCutStore->pCuts[lVar2].pArray[local_30] == pCutNew->pArray[local_30]));
          local_30 = local_30 + 1) {
      }
      if (local_30 == pCutNew->nSize) {
        return 1;
      }
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

int Ivy_NodeCutFindOrAdd( Ivy_Store_t * pCutStore, Ivy_Cut_t * pCutNew )
{
    Ivy_Cut_t * pCut;
    int i, k;
    assert( pCutNew->uHash );
    // try to find the cut
    for ( i = 0; i < pCutStore->nCuts; i++ )
    {
        pCut = pCutStore->pCuts + i;
        if ( pCut->uHash == pCutNew->uHash && pCut->nSize == pCutNew->nSize )
        {
            for ( k = 0; k < pCutNew->nSize; k++ )
                if ( pCut->pArray[k] != pCutNew->pArray[k] )
                    break;
            if ( k == pCutNew->nSize )
                return 1;
        }
    }
    assert( pCutStore->nCuts < pCutStore->nCutsMax );
    // add the cut
    pCut = pCutStore->pCuts + pCutStore->nCuts++;
    *pCut = *pCutNew;
    return 0;
}